

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O2

GLuint gl4cts::KHRDebug::LabelsTest::createQuery(Functions *gl,RenderContext *rc)

{
  bool bVar1;
  uint in_EAX;
  ContextType ctxType;
  GLenum err;
  int line;
  char *msg;
  ulong uStack_18;
  GLuint id;
  
  uStack_18 = (ulong)in_EAX;
  ctxType.super_ApiType.m_bits = (ApiType)(*rc->_vptr_RenderContext[2])(rc);
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  if (bVar1) {
    (*gl->createQueries)(0x8e28,1,&id);
    err = (*gl->getError)();
    msg = "CreateQueries";
    line = 0x3ce;
  }
  else {
    (*gl->genQueries)(1,&id);
    (*gl->beginQuery)(0x8914,id);
    (*gl->endQuery)(0x8914);
    err = (*gl->getError)();
    msg = "GenQueries / BeginQuery / EndQuery";
    line = 0x3d5;
  }
  glu::checkError(err,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                  ,line);
  return id;
}

Assistant:

GLuint LabelsTest::createQuery(const Functions* gl, const glu::RenderContext* rc)
{
	GLuint id = 0;
	if (glu::contextSupports(rc->getType(), glu::ApiType::core(4, 5)))
	{
		gl->createQueries(GL_TIMESTAMP, 1, &id);
		GLU_EXPECT_NO_ERROR(gl->getError(), "CreateQueries");
	}
	else
	{
		gl->genQueries(1, &id);
		gl->beginQuery(GL_SAMPLES_PASSED, id);
		gl->endQuery(GL_SAMPLES_PASSED);
		GLU_EXPECT_NO_ERROR(gl->getError(), "GenQueries / BeginQuery / EndQuery");
	}

	return id;
}